

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompiledEvalInternal
              (xmlXPathCompExprPtr comp,xmlXPathContextPtr ctxt,xmlXPathObjectPtr *resObjPtr,
              int toBool)

{
  xmlXPathParserContextPtr ctxt_00;
  xmlXPathObjectPtr pxStack_40;
  int res;
  xmlXPathObjectPtr resObj;
  xmlXPathParserContextPtr pctxt;
  int toBool_local;
  xmlXPathObjectPtr *resObjPtr_local;
  xmlXPathContextPtr ctxt_local;
  xmlXPathCompExprPtr comp_local;
  
  pxStack_40 = (xmlXPathObjectPtr)0x0;
  if (comp == (xmlXPathCompExprPtr)0x0) {
    comp_local._4_4_ = -1;
  }
  else {
    xmlInitParser();
    xmlResetError(&ctxt->lastError);
    ctxt_00 = xmlXPathCompParserContext(comp,ctxt);
    if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
      comp_local._4_4_ = -1;
    }
    else {
      comp_local._4_4_ = xmlXPathRunEval(ctxt_00,toBool);
      if (ctxt_00->error == 0) {
        if (ctxt_00->valueNr == (uint)(toBool == 0)) {
          if (toBool == 0) {
            pxStack_40 = xmlXPathValuePop(ctxt_00);
          }
        }
        else {
          xmlXPathErr(ctxt_00,0x17);
        }
      }
      if (resObjPtr == (xmlXPathObjectPtr *)0x0) {
        xmlXPathReleaseObject(ctxt,pxStack_40);
      }
      else {
        *resObjPtr = pxStack_40;
      }
      ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
      xmlXPathFreeParserContext(ctxt_00);
    }
  }
  return comp_local._4_4_;
}

Assistant:

static int
xmlXPathCompiledEvalInternal(xmlXPathCompExprPtr comp,
			     xmlXPathContextPtr ctxt,
			     xmlXPathObjectPtr *resObjPtr,
			     int toBool)
{
    xmlXPathParserContextPtr pctxt;
    xmlXPathObjectPtr resObj = NULL;
    int res;

    if (comp == NULL)
	return(-1);
    xmlInitParser();

    xmlResetError(&ctxt->lastError);

    pctxt = xmlXPathCompParserContext(comp, ctxt);
    if (pctxt == NULL)
        return(-1);
    res = xmlXPathRunEval(pctxt, toBool);

    if (pctxt->error == XPATH_EXPRESSION_OK) {
        if (pctxt->valueNr != ((toBool) ? 0 : 1))
            xmlXPathErr(pctxt, XPATH_STACK_ERROR);
        else if (!toBool)
            resObj = xmlXPathValuePop(pctxt);
    }

    if (resObjPtr)
        *resObjPtr = resObj;
    else
        xmlXPathReleaseObject(ctxt, resObj);

    pctxt->comp = NULL;
    xmlXPathFreeParserContext(pctxt);

    return(res);
}